

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipm.cc
# Opt level: O0

void __thiscall ipx::IPM::ComputeStartingPoint(IPM *this)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  double *pdVar4;
  void *extraout_RDX;
  void *in_RSI;
  long in_RDI;
  SparseMatrix *pSVar5;
  double dVar6;
  Int j_6;
  double zshift2;
  double xshift2;
  Int j_5;
  double mu;
  double zsum;
  double xsum;
  Int j_4;
  double zshift1;
  double zval;
  Int j_3;
  double zinfeas;
  double rho;
  double znorm;
  double tol_1;
  Int j_2;
  double cnorm;
  double xshift1;
  Int j_1;
  double xinfeas;
  double tol;
  double xj;
  Int j;
  Vector rb;
  Vector zu;
  Vector zl;
  Vector y;
  Vector xu;
  Vector xl;
  Vector x;
  Vector *ub;
  Vector *lb;
  Vector *c;
  Vector *b;
  SparseMatrix *AI;
  Int n;
  Int m;
  Model *model;
  valarray<double> *in_stack_fffffffffffffb38;
  Iterate *in_stack_fffffffffffffb40;
  Iterate *in_stack_fffffffffffffb48;
  valarray<double> *in_stack_fffffffffffffb50;
  SparseMatrix *pSVar7;
  valarray<double> *in_stack_fffffffffffffb58;
  undefined7 in_stack_fffffffffffffb60;
  undefined1 in_stack_fffffffffffffb67;
  Vector *in_stack_fffffffffffffb68;
  SparseMatrix *in_stack_fffffffffffffb70;
  Vector *in_stack_fffffffffffffb78;
  undefined7 in_stack_fffffffffffffb80;
  undefined1 in_stack_fffffffffffffb87;
  Vector *in_stack_fffffffffffffb88;
  Iterate *in_stack_fffffffffffffb90;
  Vector *in_stack_fffffffffffffba0;
  double local_2d0;
  double local_2a0;
  int local_1bc;
  int local_1a4;
  double local_1a0;
  double local_190;
  int local_184;
  double local_178;
  double local_170;
  double local_168;
  int local_15c;
  double local_158 [2];
  _BinBase1<std::__multiplies,_std::valarray<double>_> local_148;
  undefined8 local_138;
  double local_130;
  double local_128;
  undefined8 local_120;
  int local_114;
  double local_110;
  double local_108;
  double local_100;
  double local_f8;
  int local_ec;
  double local_e8 [3];
  double local_d0;
  int local_c8;
  undefined4 local_c4;
  valarray<double> local_b0;
  valarray<double> local_a0 [2];
  valarray<double> local_80 [2];
  valarray<double> local_60;
  valarray<double> local_50;
  Vector *local_40;
  Vector *local_38;
  undefined8 local_30;
  Vector *local_28;
  SparseMatrix *local_20;
  Int local_18;
  Int local_14;
  Model *local_10;
  
  local_10 = Iterate::model(*(Iterate **)(in_RDI + 0x10));
  local_14 = Model::rows(local_10);
  local_18 = Model::cols(local_10);
  local_20 = Model::AI(local_10);
  local_28 = Model::b(local_10);
  iVar3 = Model::c(local_10,in_RSI,extraout_RDX);
  local_30 = CONCAT44(extraout_var,iVar3);
  local_38 = Model::lb(local_10);
  local_40 = Model::ub(local_10);
  std::valarray<double>::valarray
            ((valarray<double> *)in_stack_fffffffffffffb40,(size_t)in_stack_fffffffffffffb38);
  std::valarray<double>::valarray
            ((valarray<double> *)in_stack_fffffffffffffb40,(size_t)in_stack_fffffffffffffb38);
  std::valarray<double>::valarray
            ((valarray<double> *)in_stack_fffffffffffffb40,(size_t)in_stack_fffffffffffffb38);
  std::valarray<double>::valarray
            ((valarray<double> *)in_stack_fffffffffffffb40,(size_t)in_stack_fffffffffffffb38);
  std::valarray<double>::valarray
            ((valarray<double> *)in_stack_fffffffffffffb40,(size_t)in_stack_fffffffffffffb38);
  std::valarray<double>::valarray
            ((valarray<double> *)in_stack_fffffffffffffb40,(size_t)in_stack_fffffffffffffb38);
  std::valarray<double>::valarray
            ((valarray<double> *)in_stack_fffffffffffffb40,(size_t)in_stack_fffffffffffffb38);
  KKTSolver::Factorize
            ((KKTSolver *)in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,
             (Info *)in_stack_fffffffffffffb40);
  if (*(int *)(*(long *)(in_RDI + 0x18) + 0xc) == 0) {
    std::valarray<double>::operator=
              ((valarray<double> *)in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
    for (local_c8 = 0; local_c8 < local_18 + local_14; local_c8 = local_c8 + 1) {
      local_d0 = 0.0;
      pdVar4 = std::valarray<double>::operator[](local_38,(long)local_c8);
      if (0.0 < *pdVar4) {
        pdVar4 = std::valarray<double>::operator[](local_38,(long)local_c8);
        local_d0 = *pdVar4;
      }
      dVar6 = local_d0;
      pdVar4 = std::valarray<double>::operator[](local_40,(long)local_c8);
      if (*pdVar4 <= dVar6 && dVar6 != *pdVar4) {
        pdVar4 = std::valarray<double>::operator[](local_40,(long)local_c8);
        local_d0 = *pdVar4;
      }
      dVar6 = local_d0;
      pdVar4 = std::valarray<double>::operator[](&local_50,(long)local_c8);
      *pdVar4 = dVar6;
      if ((local_d0 != 0.0) || (NAN(local_d0))) {
        ScatterColumn(in_stack_fffffffffffffb70,(Int)((ulong)in_stack_fffffffffffffb68 >> 0x20),
                      (double)CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60),
                      in_stack_fffffffffffffb58);
      }
    }
    local_e8[2] = Infnorm((Vector *)CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60));
    local_e8[2] = local_e8[2] * 0.1;
    local_e8[1] = 0.0;
    std::valarray<double>::operator=
              ((valarray<double> *)in_stack_fffffffffffffb40,(double *)in_stack_fffffffffffffb38);
    KKTSolver::Solve((KKTSolver *)in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,
                     (Vector *)CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60),
                     (double)in_stack_fffffffffffffb58,in_stack_fffffffffffffb50,
                     (Vector *)in_stack_fffffffffffffb48,(Info *)in_stack_fffffffffffffb40);
    if (*(int *)(*(long *)(in_RDI + 0x18) + 0xc) == 0) {
      std::valarray<double>::operator+=
                ((valarray<double> *)CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60),
                 in_stack_fffffffffffffb58);
      local_e8[0] = 0.0;
      for (local_ec = 0; local_ec < local_18 + local_14; local_ec = local_ec + 1) {
        pdVar4 = std::valarray<double>::operator[](&local_50,(long)local_ec);
        dVar6 = *pdVar4;
        pdVar4 = std::valarray<double>::operator[](local_38,(long)local_ec);
        dVar1 = *pdVar4;
        pdVar4 = std::valarray<double>::operator[](&local_60,(long)local_ec);
        *pdVar4 = dVar6 - dVar1;
        pdVar4 = std::valarray<double>::operator[](&local_60,(long)local_ec);
        local_f8 = -*pdVar4;
        pdVar4 = std::max<double>(local_e8,&local_f8);
        local_e8[0] = *pdVar4;
        pdVar4 = std::valarray<double>::operator[](local_40,(long)local_ec);
        dVar6 = *pdVar4;
        pdVar4 = std::valarray<double>::operator[](&local_50,(long)local_ec);
        dVar1 = *pdVar4;
        pdVar4 = std::valarray<double>::operator[](local_80,(long)local_ec);
        *pdVar4 = dVar6 - dVar1;
        pdVar4 = std::valarray<double>::operator[](local_80,(long)local_ec);
        local_100 = -*pdVar4;
        pdVar4 = std::max<double>(local_e8,&local_100);
        local_e8[0] = *pdVar4;
      }
      local_108 = local_e8[0] * 1.5 + 1.0;
      std::valarray<double>::operator+=
                (in_stack_fffffffffffffb50,(double *)in_stack_fffffffffffffb48);
      std::valarray<double>::operator+=
                (in_stack_fffffffffffffb50,(double *)in_stack_fffffffffffffb48);
      local_110 = Twonorm((Vector *)CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60));
      if ((local_110 != 0.0) || (NAN(local_110))) {
        local_120 = 0;
        std::valarray<double>::operator=
                  ((valarray<double> *)in_stack_fffffffffffffb40,(double *)in_stack_fffffffffffffb38
                  );
        local_128 = Infnorm((Vector *)CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60))
        ;
        local_128 = local_128 * 0.1;
        KKTSolver::Solve((KKTSolver *)in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,
                         (Vector *)CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60),
                         (double)in_stack_fffffffffffffb58,in_stack_fffffffffffffb50,
                         (Vector *)in_stack_fffffffffffffb48,(Info *)in_stack_fffffffffffffb40);
        if (*(int *)(*(long *)(in_RDI + 0x18) + 0xc) != 0) {
          local_c4 = 1;
          goto LAB_00825931;
        }
        std::valarray<double>::operator=
                  ((valarray<double> *)in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
        MultiplyAdd((SparseMatrix *)in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,
                    (double)CONCAT17(in_stack_fffffffffffffb87,in_stack_fffffffffffffb80),
                    in_stack_fffffffffffffb78,(char)((ulong)in_stack_fffffffffffffb70 >> 0x38));
        local_130 = Twonorm((Vector *)CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60))
        ;
        local_138 = 0x3fa999999999999a;
        if (local_130 < local_110 * 0.05) {
          local_148 = (_BinBase1<std::__multiplies,_std::valarray<double>_>)
                      std::operator*((value_type_conflict1 *)in_stack_fffffffffffffb50,
                                     (valarray<double> *)in_stack_fffffffffffffb48);
          std::valarray<double>::operator+=
                    (in_stack_fffffffffffffb50,
                     (_Expr<std::__detail::_BinClos<std::__multiplies,_std::_Constant,_std::_ValArray,_double,_double>,_double>
                      *)in_stack_fffffffffffffb48);
          local_158[1] = 0.95;
          std::valarray<double>::operator*=
                    (in_stack_fffffffffffffb50,(double *)in_stack_fffffffffffffb48);
        }
        local_158[0] = 0.0;
        for (local_15c = 0; local_15c < local_18 + local_14; local_15c = local_15c + 1) {
          pdVar4 = std::valarray<double>::operator[](local_a0,(long)local_15c);
          local_168 = *pdVar4;
          pdVar4 = std::valarray<double>::operator[](local_a0,(long)local_15c);
          *pdVar4 = 0.0;
          pdVar4 = std::valarray<double>::operator[](&local_b0,(long)local_15c);
          *pdVar4 = 0.0;
          pdVar4 = std::valarray<double>::operator[](local_38,(long)local_15c);
          bVar2 = std::isfinite(*pdVar4);
          if (bVar2) {
            pdVar4 = std::valarray<double>::operator[](local_40,(long)local_15c);
            bVar2 = std::isfinite(*pdVar4);
            if (!bVar2) goto LAB_00825062;
            dVar6 = local_168 * 0.5;
            pdVar4 = std::valarray<double>::operator[](local_a0,(long)local_15c);
            *pdVar4 = dVar6;
            dVar6 = local_168 * -0.5;
            pdVar4 = std::valarray<double>::operator[](&local_b0,(long)local_15c);
            *pdVar4 = dVar6;
          }
          else {
LAB_00825062:
            pdVar4 = std::valarray<double>::operator[](local_38,(long)local_15c);
            bVar2 = std::isfinite(*pdVar4);
            dVar6 = local_168;
            if (bVar2) {
              pdVar4 = std::valarray<double>::operator[](local_a0,(long)local_15c);
              *pdVar4 = dVar6;
            }
            else {
              pdVar4 = std::valarray<double>::operator[](local_40,(long)local_15c);
              bVar2 = std::isfinite(*pdVar4);
              if (bVar2) {
                dVar6 = -local_168;
                pdVar4 = std::valarray<double>::operator[](&local_b0,(long)local_15c);
                *pdVar4 = dVar6;
              }
            }
          }
          pdVar4 = std::valarray<double>::operator[](local_a0,(long)local_15c);
          local_170 = -*pdVar4;
          pdVar4 = std::max<double>(local_158,&local_170);
          local_158[0] = *pdVar4;
          pdVar4 = std::valarray<double>::operator[](&local_b0,(long)local_15c);
          local_178 = -*pdVar4;
          pdVar4 = std::max<double>(local_158,&local_178);
          local_158[0] = *pdVar4;
        }
        dVar6 = local_158[0] * 1.5 + 1.0;
        for (local_184 = 0; local_184 < local_18 + local_14; local_184 = local_184 + 1) {
          pdVar4 = std::valarray<double>::operator[](local_38,(long)local_184);
          bVar2 = std::isfinite(*pdVar4);
          if (bVar2) {
            pdVar4 = std::valarray<double>::operator[](local_a0,(long)local_184);
            *pdVar4 = dVar6 + *pdVar4;
          }
          pdVar4 = std::valarray<double>::operator[](local_40,(long)local_184);
          bVar2 = std::isfinite(*pdVar4);
          if (bVar2) {
            pdVar4 = std::valarray<double>::operator[](&local_b0,(long)local_184);
            *pdVar4 = dVar6 + *pdVar4;
          }
        }
      }
      else {
        for (local_114 = 0; local_114 < local_18 + local_14; local_114 = local_114 + 1) {
          pdVar4 = std::valarray<double>::operator[](local_38,(long)local_114);
          bVar2 = std::isfinite(*pdVar4);
          local_2a0 = 1.0;
          if (!bVar2) {
            local_2a0 = 0.0;
          }
          pdVar4 = std::valarray<double>::operator[](local_a0,(long)local_114);
          *pdVar4 = local_2a0;
          pdVar4 = std::valarray<double>::operator[](local_40,(long)local_114);
          bVar2 = std::isfinite(*pdVar4);
          local_2d0 = 1.0;
          if (!bVar2) {
            local_2d0 = 0.0;
          }
          pdVar4 = std::valarray<double>::operator[](&local_b0,(long)local_114);
          *pdVar4 = local_2d0;
        }
      }
      local_190 = 1.0;
      local_1a0 = 1.0;
      for (local_1a4 = 0; local_1a4 < local_18 + local_14; local_1a4 = local_1a4 + 1) {
        pdVar4 = std::valarray<double>::operator[](local_38,(long)local_1a4);
        bVar2 = std::isfinite(*pdVar4);
        if (bVar2) {
          pdVar4 = std::valarray<double>::operator[](&local_60,(long)local_1a4);
          local_190 = local_190 + *pdVar4;
          std::valarray<double>::operator[](local_a0,(long)local_1a4);
          pdVar4 = std::valarray<double>::operator[](&local_60,(long)local_1a4);
          dVar6 = *pdVar4;
          pdVar4 = std::valarray<double>::operator[](local_a0,(long)local_1a4);
          local_1a0 = dVar6 * *pdVar4 + local_1a0;
        }
        pdVar4 = std::valarray<double>::operator[](local_40,(long)local_1a4);
        bVar2 = std::isfinite(*pdVar4);
        if (bVar2) {
          pdVar4 = std::valarray<double>::operator[](local_80,(long)local_1a4);
          local_190 = local_190 + *pdVar4;
          std::valarray<double>::operator[](&local_b0,(long)local_1a4);
          in_stack_fffffffffffffba0 =
               (Vector *)std::valarray<double>::operator[](local_80,(long)local_1a4);
          in_stack_fffffffffffffb90 = (Iterate *)in_stack_fffffffffffffba0->_M_size;
          pdVar4 = std::valarray<double>::operator[](&local_b0,(long)local_1a4);
          local_1a0 = (double)in_stack_fffffffffffffb90 * *pdVar4 + local_1a0;
        }
      }
      pSVar5 = (SparseMatrix *)((local_1a0 * 0.5) / local_190);
      std::valarray<double>::operator+=
                (in_stack_fffffffffffffb50,(double *)in_stack_fffffffffffffb48);
      std::valarray<double>::operator+=
                (in_stack_fffffffffffffb50,(double *)in_stack_fffffffffffffb48);
      for (local_1bc = 0; local_1bc < local_18 + local_14; local_1bc = local_1bc + 1) {
        in_stack_fffffffffffffb88 =
             (Vector *)std::valarray<double>::operator[](local_38,(long)local_1bc);
        in_stack_fffffffffffffb87 = std::isfinite((double)in_stack_fffffffffffffb88->_M_size);
        if ((bool)in_stack_fffffffffffffb87) {
          in_stack_fffffffffffffb70 = pSVar5;
          in_stack_fffffffffffffb78 =
               (Vector *)std::valarray<double>::operator[](local_a0,(long)local_1bc);
          in_stack_fffffffffffffb78->_M_size =
               (size_t)((double)in_stack_fffffffffffffb70 +
                       (double)in_stack_fffffffffffffb78->_M_size);
        }
        in_stack_fffffffffffffb68 =
             (Vector *)std::valarray<double>::operator[](local_40,(long)local_1bc);
        bVar2 = std::isfinite((double)in_stack_fffffffffffffb68->_M_size);
        if (bVar2) {
          pSVar7 = pSVar5;
          pdVar4 = std::valarray<double>::operator[](&local_b0,(long)local_1bc);
          *pdVar4 = (double)pSVar7 + *pdVar4;
        }
      }
      Iterate::Initialize(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,
                          (Vector *)CONCAT17(in_stack_fffffffffffffb87,in_stack_fffffffffffffb80),
                          in_stack_fffffffffffffb78,(Vector *)in_stack_fffffffffffffb70,
                          in_stack_fffffffffffffb68,in_stack_fffffffffffffba0);
      dVar6 = Iterate::complementarity(in_stack_fffffffffffffb40);
      *(double *)(in_RDI + 0x38) = dVar6;
      local_c4 = 0;
    }
    else {
      local_c4 = 1;
    }
  }
  else {
    local_c4 = 1;
  }
LAB_00825931:
  std::valarray<double>::~valarray((valarray<double> *)in_stack_fffffffffffffb40);
  std::valarray<double>::~valarray((valarray<double> *)in_stack_fffffffffffffb40);
  std::valarray<double>::~valarray((valarray<double> *)in_stack_fffffffffffffb40);
  std::valarray<double>::~valarray((valarray<double> *)in_stack_fffffffffffffb40);
  std::valarray<double>::~valarray((valarray<double> *)in_stack_fffffffffffffb40);
  std::valarray<double>::~valarray((valarray<double> *)in_stack_fffffffffffffb40);
  std::valarray<double>::~valarray((valarray<double> *)in_stack_fffffffffffffb40);
  return;
}

Assistant:

void IPM::ComputeStartingPoint() {
    const Model& model = iterate_->model();
    const Int m = model.rows();
    const Int n = model.cols();
    const SparseMatrix& AI = model.AI();
    const Vector& b = model.b();
    const Vector& c = model.c();
    const Vector& lb = model.lb();
    const Vector& ub = model.ub();
    Vector x(n+m), xl(n+m), xu(n+m), y(m), zl(n+m), zu(n+m);
    Vector rb(m);               // workspace

    // Factorize the KKT matrix with the identity matrix in the (1,1) block.
    kkt_->Factorize(nullptr, info_);
    if (info_->errflag)
        return;

    // Set x within its bounds and compute the minimum norm solution dx to
    // AI*dx = (b-AI*x). Then update x := x + dx to obtain a feasible point.
    rb = b;
    for (Int j = 0; j < n+m; j++) {
        double xj = 0.0;
        if (xj < lb[j])
            xj = lb[j];
        if (xj > ub[j])
            xj = ub[j];
        x[j] = xj;
        if (xj != 0.0)
            ScatterColumn(AI, j, -xj, rb);
    }
    double tol = 0.1 * Infnorm(rb);
    zl = 0.0;
    kkt_->Solve(zl, rb, tol, xl, y, info_);
    if (info_->errflag)
        return;
    x += xl;

    // Compute xl, xu and shift to become positive.
    double xinfeas = 0.0;
    for (Int j = 0; j < n+m; j++) {
        xl[j] = x[j]-lb[j];
        xinfeas = std::max(xinfeas, -xl[j]);
        xu[j] = ub[j]-x[j];
        xinfeas = std::max(xinfeas, -xu[j]);
    }
    double xshift1 = 1.0 + 1.5*xinfeas;
    xl += xshift1;
    xu += xshift1;

    const double cnorm = Twonorm(c);
    if (cnorm == 0.0) {
        // Special treatment for zero objective.
        for (Int j = 0; j < n+m; j++) {
            zl[j] = std::isfinite(lb[j]) ? 1.0 : 0.0;
            zu[j] = std::isfinite(ub[j]) ? 1.0 : 0.0;
        }
    } else {
        // Compute y as the least-squares solution to AI'*y=c.
        // Recompute zl = c-AI'*y because the KKT system is solved
        // approximately with a residual in the first block equation.
        rb = 0.0;
        double tol = 0.1 * Infnorm(c);
        kkt_->Solve(c, rb, tol, zl, y, info_);
        if (info_->errflag)
            return;
        zl = c;
        MultiplyAdd(AI, y, -1.0, zl, 'T');

        // When c lies in range(AI'), then the dual slack variables are (close
        // to) zero, and the initial point would be almost complementary but
        // usually not primal feasible. To prevent this from happening, add
        // a fraction of the objective to zl and adjust y. In exact computation
        // this does not affect dual feasibility.
        const double znorm = Twonorm(zl);
        const double rho = 0.05;
        if (znorm < rho*cnorm) {
            zl += rho * c;
            y *= (1.0-rho);
        }

        // Split dual slack solution into zl, zu and shift to become positive.
        double zinfeas = 0.0;
        for (Int j = 0; j < n+m; j++) {
            double zval = zl[j];
            zl[j] = 0.0;
            zu[j] = 0.0;
            if (std::isfinite(lb[j]) && std::isfinite(ub[j])) {
                zl[j] = 0.5*zval;
                zu[j] = -0.5*zval;
            }
            else if (std::isfinite(lb[j]))
                zl[j] = zval;
            else if (std::isfinite(ub[j]))
                zu[j] = -zval;
            zinfeas = std::max(zinfeas, -zl[j]);
            zinfeas = std::max(zinfeas, -zu[j]);
        }
        double zshift1 = 1.0 + 1.5*zinfeas;
        for (Int j = 0; j < n+m; j++) {
            if (std::isfinite(lb[j]))
                zl[j] += zshift1;
            if (std::isfinite(ub[j]))
                zu[j] += zshift1;
        }
    }

    // Level pairwise complementarity products.
    double xsum = 1.0;
    double zsum = 1.0;
    double mu = 1.0;
    for (Int j = 0; j < n+m; j++) {
        if (std::isfinite(lb[j])) {
            xsum += xl[j];
            zsum += zl[j];
            mu += xl[j]*zl[j];
        }
        if (std::isfinite(ub[j])) {
            xsum += xu[j];
            zsum += zu[j];
            mu += xu[j]*zu[j];
        }
    }
    double xshift2 = 0.5*mu/zsum;
    double zshift2 = 0.5*mu/xsum;
    xl += xshift2;
    xu += xshift2;
    for (Int j = 0; j < n+m; j++) {
        if (std::isfinite(lb[j]))
            zl[j] += zshift2;
        if (std::isfinite(ub[j]))
            zu[j] += zshift2;
    }
    iterate_->Initialize(x, xl, xu, y, zl, zu);
    best_complementarity_ = iterate_->complementarity();
}